

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManFindTwoUnate(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t **vUnateLits,
                       Vec_Int_t **vUnateLitsW,int fVerbose)

{
  int iVar1;
  uint local_48;
  int local_44;
  int nPairs;
  int iLit;
  int n;
  int fVerbose_local;
  Vec_Int_t **vUnateLitsW_local;
  Vec_Int_t **vUnateLits_local;
  Vec_Ptr_t *pVStack_20;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  word **pSets_local;
  
  iLit = fVerbose;
  _n = vUnateLitsW;
  vUnateLitsW_local = vUnateLits;
  vUnateLits_local._4_4_ = nWords;
  pVStack_20 = vDivs;
  vDivs_local = (Vec_Ptr_t *)pSets;
  if (fVerbose != 0) {
    printf("  ");
  }
  nPairs = 0;
  while( true ) {
    if (1 < nPairs) {
      return -1;
    }
    local_44 = Gia_ManFindTwoUnateInt
                         (*(word **)(&vDivs_local->nCap + (long)nPairs * 2),
                          *(word **)(&vDivs_local->nCap +
                                    (long)(int)(uint)((nPairs != 0 ^ 0xffU) & 1) * 2),pVStack_20,
                          vUnateLits_local._4_4_,vUnateLitsW_local[nPairs],_n[nPairs],
                          (int *)&local_48);
    if (iLit != 0) {
      printf("UU%d =%5d ",(ulong)(uint)nPairs,(ulong)local_48);
    }
    if (-1 < local_44) break;
    nPairs = nPairs + 1;
  }
  iVar1 = Abc_LitNotCond(local_44,nPairs);
  return iVar1;
}

Assistant:

int Gia_ManFindTwoUnate( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits[2], Vec_Int_t * vUnateLitsW[2], int fVerbose )
{
    int n, iLit, nPairs;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        //int nPairsAll = Vec_IntSize(vUnateLits[n])*(Vec_IntSize(vUnateLits[n])-1)/2;
        iLit = Gia_ManFindTwoUnateInt( pSets[n], pSets[!n], vDivs, nWords, vUnateLits[n], vUnateLitsW[n], &nPairs );
        if ( fVerbose ) printf( "UU%d =%5d ", n, nPairs );
        if ( iLit >= 0 )
            return Abc_LitNotCond(iLit, n);
    }
    return -1;
}